

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

uchar * __thiscall MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  MD5 *pMVar1;
  char *in_stack_ffffffffffffffd8;
  
  init(this,(EVP_PKEY_CTX *)d);
  pMVar1 = (MD5 *)std::__cxx11::string::c_str();
  std::__cxx11::string::length();
  update(pMVar1,in_stack_ffffffffffffffd8,0);
  pMVar1 = finalize((MD5 *)d);
  return &pMVar1->finalized;
}

Assistant:

MD5::MD5(const std::string &text)
{
  init();
  update(text.c_str(), text.length());
  finalize();
}